

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O1

Vec3fx * embree::copyArrayToUSM<embree::Vec3fx>(avector<embree::Vec3fx> *in)

{
  void *__dest;
  Vec3fx *pVVar1;
  
  __dest = alignedUSMMalloc(in->size_active << 4,0x10,DEVICE_READ_ONLY);
  pVVar1 = (Vec3fx *)memcpy(__dest,in->items,in->size_active << 4);
  return pVVar1;
}

Assistant:

Ty* copyArrayToUSM(const avector<Ty>& in) {
    Ty* out = (Ty*)alignedUSMMalloc(in.size()*sizeof(Ty));
    memcpy((void*)out,in.data(),in.size()*sizeof(Ty));
    return out;
  }